

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

void __thiscall wasm::Vacuum::visitBlock(Vacuum *this,Block *curr)

{
  ExpressionList *this_00;
  TypeUpdater *this_01;
  Type type;
  bool bVar1;
  Expression **ppEVar2;
  Expression *to;
  Expression *pEVar3;
  undefined1 allowTypeChange;
  undefined8 in_RCX;
  uint uVar4;
  ulong index;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  
  this_00 = &curr->list;
  sVar7 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  this_01 = &this->typeUpdater;
  index = 0;
  uVar6 = 0;
  do {
    allowTypeChange = (undefined1)in_RCX;
    iVar5 = (int)uVar6;
    if (sVar7 == index) {
      if (0 < iVar5) {
        sVar7 = sVar7 - uVar6;
LAB_009c76c2:
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,sVar7
                  );
        TypeUpdater::maybeUpdateTypeToUnreachable(this_01,curr);
      }
      pEVar3 = BlockUtils::simplifyToContents<wasm::Vacuum>
                         ((BlockUtils *)curr,(Block *)this,(Vacuum *)0x0,(bool)allowTypeChange);
      replaceCurrent(this,pEVar3);
      return;
    }
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this_00->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,index);
    pEVar3 = *ppEVar2;
    if ((sVar7 - 1 == index) &&
       (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id)) {
      bVar1 = ExpressionAnalyzer::isResultUsed
                        (&(this->
                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                          ).
                          super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                          .expressionStack,
                         (this->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                         .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                         super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currFunction
                        );
    }
    else {
      bVar1 = false;
    }
    in_RCX = 1;
    to = optimize(this,pEVar3,bVar1,true);
    if (to != (Expression *)0x0) {
LAB_009c758c:
      if (to != pEVar3) {
        in_RCX = 0;
        TypeUpdater::noteReplacement(this_01,pEVar3,to,false);
        ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        *ppEVar2 = to;
      }
LAB_009c75b3:
      if (0 < iVar5) {
        ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        pEVar3 = *ppEVar2;
        ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index - uVar6);
        *ppEVar2 = pEVar3;
        ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        *ppEVar2 = (Expression *)0x0;
      }
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index - (long)iVar5);
      if ((sVar7 - 1 <= index) || (((*ppEVar2)->type).id != 1)) goto LAB_009c765e;
      sVar7 = (index - (long)iVar5) + 1;
      uVar4 = (int)index - iVar5;
      while( true ) {
        allowTypeChange = (undefined1)in_RCX;
        uVar4 = uVar4 + 1;
        if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements <= (ulong)uVar4) break;
        ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)uVar4);
        if (*ppEVar2 != (Expression *)0x0) {
          TypeUpdater::noteRecursiveRemoval(this_01,*ppEVar2);
        }
      }
      goto LAB_009c76c2;
    }
    type.id = (pEVar3->type).id;
    if (type.id < 2) {
      if (type.id == 1) goto LAB_009c75b3;
    }
    else {
      bVar1 = LiteralUtils::canMakeZero(type);
      if (!bVar1) goto LAB_009c75b3;
      to = LiteralUtils::makeZero
                     (type,(this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                           super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule
                     );
      if (to != (Expression *)0x0) goto LAB_009c758c;
    }
    TypeUpdater::noteRecursiveRemoval(this_01,pEVar3);
    uVar6 = (ulong)(iVar5 + 1);
LAB_009c765e:
    index = index + 1;
  } while( true );
}

Assistant:

void visitBlock(Block* curr) {
    // compress out nops and other dead code
    int skip = 0;
    auto& list = curr->list;
    size_t size = list.size();
    for (size_t z = 0; z < size; z++) {
      auto* child = list[z];
      // The last element may be used.
      bool used =
        z == size - 1 && curr->type.isConcrete() &&
        ExpressionAnalyzer::isResultUsed(expressionStack, getFunction());
      auto* optimized = optimize(child, used, true);
      if (!optimized) {
        auto childType = child->type;
        if (childType.isConcrete()) {
          if (LiteralUtils::canMakeZero(childType)) {
            // We can't just skip a final concrete element, even if it isn't
            // used. Instead, replace it with something that's easy to optimize
            // out (for example, code-folding can merge out identical zeros at
            // the end of if arms).
            optimized = LiteralUtils::makeZero(childType, *getModule());
          } else {
            // Don't optimize it out.
            optimized = child;
          }
        } else if (childType == Type::unreachable) {
          // Don't try to optimize out an unreachable child (dce can do that
          // properly).
          optimized = child;
        }
      }
      if (!optimized) {
        typeUpdater.noteRecursiveRemoval(child);
        skip++;
      } else {
        if (optimized != child) {
          typeUpdater.noteReplacement(child, optimized);
          list[z] = optimized;
        }
        if (skip > 0) {
          list[z - skip] = list[z];
          list[z] = nullptr;
        }
        // if this is unreachable, the rest is dead code
        if (list[z - skip]->type == Type::unreachable && z < size - 1) {
          for (Index i = z - skip + 1; i < list.size(); i++) {
            auto* remove = list[i];
            if (remove) {
              typeUpdater.noteRecursiveRemoval(remove);
            }
          }
          list.resize(z - skip + 1);
          typeUpdater.maybeUpdateTypeToUnreachable(curr);
          skip = 0; // nothing more to do on the list
          break;
        }
      }
    }
    if (skip > 0) {
      list.resize(size - skip);
      typeUpdater.maybeUpdateTypeToUnreachable(curr);
    }
    // the block may now be a trivial one that we can get rid of and just leave
    // its contents
    replaceCurrent(BlockUtils::simplifyToContents(curr, this));
  }